

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::verifyHelperInvocationDerivate
               (TestLog *log,Surface *result,bool isMultiSample)

{
  bool bVar1;
  RGBA RVar2;
  int iVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  bool local_851;
  MessageBuilder local_848;
  MessageBuilder local_6c8;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  LogImage local_4f8;
  MessageBuilder local_468;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  LogImage local_298;
  MessageBuilder local_1f8;
  int local_78;
  deUint32 local_74;
  undefined1 local_6e;
  byte local_6d;
  int local_6c;
  bool neighborBg;
  deUint32 dStack_68;
  bool nonZeroDeriv;
  deUint32 local_64;
  byte local_5d;
  int local_5c;
  deUint32 dStack_58;
  bool isFg;
  deUint32 local_54;
  byte local_4d;
  RGBA local_4c;
  int iStack_48;
  bool isBg;
  RGBA resPix;
  int x;
  int y;
  int iStack_38;
  bool renderedSomething;
  int numNonZeroDeriv;
  int numInvalidPixels;
  RGBA isFgThreshold;
  RGBA isBgThreshold;
  RGBA fgRef;
  RGBA bgRef;
  bool isMultiSample_local;
  Surface *result_local;
  TestLog *log_local;
  
  tcu::RGBA::RGBA(&isBgThreshold,0,0,0,0xff);
  tcu::RGBA::RGBA(&isFgThreshold,0,0xff,0,0xff);
  iVar3 = 1;
  if (isMultiSample) {
    iVar3 = 0xfe;
  }
  tcu::RGBA::RGBA((RGBA *)&numInvalidPixels,1,iVar3,0,1);
  iVar3 = 1;
  if (isMultiSample) {
    iVar3 = 0xfe;
  }
  tcu::RGBA::RGBA((RGBA *)&numNonZeroDeriv,1,iVar3,0xff,1);
  iStack_38 = 0;
  y = 0;
  bVar1 = false;
  resPix.m_value = 0;
  while( true ) {
    RVar2.m_value = resPix.m_value;
    iVar3 = tcu::Surface::getHeight(result);
    if (iVar3 <= (int)RVar2.m_value) break;
    iStack_48 = 0;
    while( true ) {
      iVar3 = iStack_48;
      iVar4 = tcu::Surface::getWidth(result);
      if (iVar4 <= iVar3) break;
      local_54 = (deUint32)tcu::Surface::getPixel(result,iStack_48,resPix.m_value);
      dStack_58 = isBgThreshold.m_value;
      local_5c = numInvalidPixels;
      local_4c = (RGBA)local_54;
      local_4d = tcu::compareThreshold((RGBA)local_54,isBgThreshold,(RGBA)numInvalidPixels);
      local_64 = local_4c.m_value;
      dStack_68 = isFgThreshold.m_value;
      local_6c = numNonZeroDeriv;
      local_5d = tcu::compareThreshold(local_4c,isFgThreshold,(RGBA)numNonZeroDeriv);
      iVar3 = tcu::RGBA::getBlue(&local_4c);
      local_6d = 0 < iVar3;
      if ((bool)local_6d) {
        local_74 = isBgThreshold.m_value;
        local_78 = numInvalidPixels;
        local_851 = hasNeighborWithColor
                              (result,iStack_48,resPix.m_value,isBgThreshold,(RGBA)numInvalidPixels)
        ;
      }
      else {
        local_851 = false;
      }
      local_6e = local_851;
      if ((local_6d & 1) != 0) {
        y = y + 1;
      }
      if ((((local_4d & 1) == 0) && ((local_5d & 1) == 0)) ||
         (((local_6d & 1) != 0 && ((local_851 == false && ((local_5d & 1) == 0)))))) {
        iStack_38 = iStack_38 + 1;
      }
      if ((local_5d & 1) != 0) {
        bVar1 = true;
      }
      iStack_48 = iStack_48 + 1;
    }
    resPix.m_value = resPix.m_value + 1;
  }
  tcu::TestLog::operator<<(&local_1f8,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1f8,(char (*) [7])0x2c3bc0c);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&y);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [80])
                             " pixels with non-zero derivate (neighbor sample has gl_HelperInvocation = true)"
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1f8);
  if (iStack_38 < 1) {
    if (bVar1) {
      tcu::TestLog::operator<<(&local_848,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_848,(char (*) [28])"All result pixels are valid");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_848);
      log_local._7_1_ = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"Result",&local_519);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"Result image",&local_541);
      tcu::LogImage::LogImage
                (&local_4f8,&local_518,&local_540,result,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::TestLog::operator<<(log,&local_4f8);
      tcu::LogImage::~LogImage(&local_4f8);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator(&local_541);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      tcu::TestLog::operator<<(&local_6c8,log,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_6c8,(char (*) [31])"ERROR: Result image was empty!");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6c8);
      log_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"Result",&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"Result image",&local_2e1);
    tcu::LogImage::LogImage(&local_298,&local_2b8,&local_2e0,result,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(log,&local_298);
    tcu::LogImage::~LogImage(&local_298);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    tcu::TestLog::operator<<(&local_468,log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_468,(char (*) [14])"ERROR: Found ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&stack0xffffffffffffffc8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [24])" invalid result pixels!");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_468);
    log_local._7_1_ = false;
  }
  return log_local._7_1_;
}

Assistant:

static bool verifyHelperInvocationDerivate (TestLog& log, const tcu::Surface& result, bool isMultiSample)
{
	const tcu::RGBA		bgRef				(0, 0, 0, 255);
	const tcu::RGBA		fgRef				(0, 255, 0, 255);
	const tcu::RGBA		isBgThreshold		(1, isMultiSample ? 254 : 1, 0, 1);
	const tcu::RGBA		isFgThreshold		(1, isMultiSample ? 254 : 1, 255, 1);
	int					numInvalidPixels	= 0;
	int					numNonZeroDeriv		= 0;
	bool				renderedSomething	= false;

	for (int y = 0; y < result.getHeight(); ++y)
	{
		for (int x = 0; x < result.getWidth(); ++x)
		{
			const tcu::RGBA	resPix			= result.getPixel(x, y);
			const bool		isBg			= tcu::compareThreshold(resPix, bgRef, isBgThreshold);
			const bool		isFg			= tcu::compareThreshold(resPix, fgRef, isFgThreshold);
			const bool		nonZeroDeriv	= resPix.getBlue() > 0;
			const bool		neighborBg		= nonZeroDeriv ? hasNeighborWithColor(result, x, y, bgRef, isBgThreshold) : false;

			if (nonZeroDeriv)
				numNonZeroDeriv	+= 1;

			if ((!isBg && !isFg) ||							// Neither of valid colors (ignoring blue channel that has derivate)
				(nonZeroDeriv && !neighborBg && !isFg))		// Has non-zero derivate, but sample not at primitive edge or inside primitive
				numInvalidPixels += 1;

			if (isFg)
				renderedSomething = true;
		}
	}

	log << TestLog::Message << "Found " << numNonZeroDeriv << " pixels with non-zero derivate (neighbor sample has gl_HelperInvocation = true)" << TestLog::EndMessage;

	if (numInvalidPixels > 0)
	{
		log << TestLog::Image("Result", "Result image", result);
		log << TestLog::Message << "ERROR: Found " << numInvalidPixels << " invalid result pixels!" << TestLog::EndMessage;
		return false;
	}
	else if (!renderedSomething)
	{
		log << TestLog::Image("Result", "Result image", result);
		log << TestLog::Message << "ERROR: Result image was empty!" << TestLog::EndMessage;
		return false;
	}
	else
	{
		log << TestLog::Message << "All result pixels are valid" << TestLog::EndMessage;
		return true;
	}
}